

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_ping_pong.c
# Opt level: O0

void handle_accept(cio_server_socket *server_socket,void *handler_context,cio_error err,
                  cio_socket *socket)

{
  cio_error cVar1;
  cio_io_stream *stream_00;
  cio_io_stream_write_handler_t *buffered_stream_00;
  cio_buffered_stream *buffered_stream;
  cio_io_stream *stream;
  echo_client *client;
  cio_socket *socket_local;
  cio_error err_local;
  void *handler_context_local;
  cio_server_socket *server_socket_local;
  
  if (err == CIO_SUCCESS) {
    cVar1 = cio_read_buffer_init
                      ((cio_read_buffer *)&socket[1].stream.write_handler_context,&socket[1].impl,
                       0x80);
    if (cVar1 == CIO_SUCCESS) {
      stream_00 = cio_socket_get_io_stream(socket);
      buffered_stream_00 = &socket[-1].stream.write_handler;
      cVar1 = cio_buffered_stream_init((cio_buffered_stream *)buffered_stream_00,stream_00);
      if (cVar1 == CIO_SUCCESS) {
        cVar1 = cio_buffered_stream_read_at_least
                          ((cio_buffered_stream *)buffered_stream_00,
                           (cio_read_buffer *)&socket[1].stream.write_handler_context,6,
                           server_handle_read,&socket[-1].stream.write_buffer);
        if (cVar1 == CIO_SUCCESS) {
          return;
        }
        fprintf(_stderr,"server could no start reading!\n");
      }
      else {
        fprintf(_stderr,"failed to init buffered stream!\n");
      }
    }
    else {
      fprintf(_stderr,"failed to init read buffer!\n");
    }
  }
  else {
    fprintf(_stderr,"accept error!\n");
  }
  cio_server_socket_close(server_socket);
  cio_eventloop_cancel((server_socket->impl).loop);
  return;
}

Assistant:

static void handle_accept(struct cio_server_socket *server_socket, void *handler_context, enum cio_error err, struct cio_socket *socket)
{
	(void)handler_context;

	struct echo_client *client = cio_container_of(socket, struct echo_client, socket);

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "accept error!\n");
		goto error;
	}

	err = cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init read buffer!\n");
		goto error;
	}

	struct cio_io_stream *stream = cio_socket_get_io_stream(socket);

	struct cio_buffered_stream *buffered_stream = &client->buffered_stream;
	err = cio_buffered_stream_init(buffered_stream, stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init buffered stream!\n");
		goto error;
	}

	err = cio_buffered_stream_read_at_least(buffered_stream, &client->rb, sizeof(HELLO), server_handle_read, client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "server could no start reading!\n");
		goto error;
	}

	return;

error:
	cio_server_socket_close(server_socket);
	cio_eventloop_cancel(server_socket->impl.loop);
}